

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_username.c
# Opt level: O2

char * get_username(void)

{
  __uid_t __uid;
  char *pcVar1;
  passwd *ppVar2;
  
  __uid = getuid();
  pcVar1 = getlogin();
  setpwent();
  if (pcVar1 != (char *)0x0) {
    ppVar2 = getpwnam(pcVar1);
    if ((ppVar2 != (passwd *)0x0) && (ppVar2->pw_uid == __uid)) goto LAB_0011e656;
  }
  ppVar2 = getpwuid(__uid);
  if (ppVar2 == (passwd *)0x0) {
    return (char *)0x0;
  }
  pcVar1 = ppVar2->pw_name;
LAB_0011e656:
  endpwent();
  pcVar1 = dupstr(pcVar1);
  return pcVar1;
}

Assistant:

char *get_username(void)
{
    struct passwd *p;
    uid_t uid = getuid();
    char *user, *ret = NULL;

    /*
     * First, find who we think we are using getlogin. If this
     * agrees with our uid, we'll go along with it. This should
     * allow sharing of uids between several login names whilst
     * coping correctly with people who have su'ed.
     */
    user = getlogin();
#if HAVE_SETPWENT
    setpwent();
#endif
    if (user)
        p = getpwnam(user);
    else
        p = NULL;
    if (p && p->pw_uid == uid) {
        /*
         * The result of getlogin() really does correspond to
         * our uid. Fine.
         */
        ret = user;
    } else {
        /*
         * If that didn't work, for whatever reason, we'll do
         * the simpler version: look up our uid in the password
         * file and map it straight to a name.
         */
        p = getpwuid(uid);
        if (!p)
            return NULL;
        ret = p->pw_name;
    }
#if HAVE_ENDPWENT
    endpwent();
#endif

    return dupstr(ret);
}